

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestraintForceModifier.cpp
# Opt level: O3

void __thiscall OpenMD::RestraintForceModifier::modifyForces(RestraintForceModifier *this)

{
  Snapshot *this_00;
  RestWriter *this_01;
  RealType RVar1;
  RealType RVar2;
  vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
  local_30;
  
  RVar1 = doRestraints(this,1.0);
  this_00 = ((this->super_ForceModifier).info_)->sman_->currentSnapshot_;
  this->currSnapshot_ = this_00;
  RVar2 = Snapshot::getRestraintPotential(this_00);
  Snapshot::setRestraintPotential(this->currSnapshot_,RVar2 + RVar1);
  RVar2 = Snapshot::getPotentialEnergy(this->currSnapshot_);
  Snapshot::setRawPotential(this->currSnapshot_,RVar2);
  Snapshot::setPotentialEnergy(this->currSnapshot_,RVar1 + RVar2);
  RVar1 = Snapshot::getTime(this->currSnapshot_);
  if (this->currRestTime_ <= RVar1) {
    this_01 = this->restOut;
    std::
    vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
    ::vector(&local_30,&this->restInfo_);
    RestWriter::writeRest(this_01,&local_30);
    std::
    vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
    ::~vector(&local_30);
    this->currRestTime_ = this->restTime_ + this->currRestTime_;
  }
  return;
}

Assistant:

void RestraintForceModifier::modifyForces() {
    RealType restPot(0.0);

    restPot = doRestraints(1.0);

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &restPot, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    currSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();
    RealType rp   = currSnapshot_->getRestraintPotential();
    currSnapshot_->setRestraintPotential(rp + restPot);

    RealType pe = currSnapshot_->getPotentialEnergy();
    currSnapshot_->setRawPotential(pe);
    currSnapshot_->setPotentialEnergy(pe + restPot);

    // write out forces and current positions of restrained molecules
    if (currSnapshot_->getTime() >= currRestTime_) {
      restOut->writeRest(restInfo_);
      currRestTime_ += restTime_;
    }
  }